

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xout.h
# Opt level: O0

void __thiscall ispring::_xout::_xout(_xout *this)

{
  _xout *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ispring::xstream_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ispring::xstream_*>_>_>
  ::map(&this->m_xstream);
  _xout_color::_xout_color(&this->black,'0');
  _xout_color::_xout_color(&this->blue,'1');
  _xout_color::_xout_color(&this->green,'2');
  _xout_color::_xout_color(&this->aqua,'3');
  _xout_color::_xout_color(&this->red,'4');
  _xout_color::_xout_color(&this->purple,'5');
  _xout_color::_xout_color(&this->yellow,'6');
  _xout_color::_xout_color(&this->white,'7');
  _xout_color::_xout_color(&this->gray,'8');
  _xout_color::_xout_color(&this->light_blue,'9');
  _xout_color::_xout_color(&this->light_green,'A');
  _xout_color::_xout_color(&this->light_aqua,'B');
  _xout_color::_xout_color(&this->light_red,'C');
  _xout_color::_xout_color(&this->light_purple,'D');
  _xout_color::_xout_color(&this->light_yellow,'E');
  _xout_color::_xout_color(&this->light_white,'F');
  return;
}

Assistant:

key_t GetKey() {
			struct timeval val;
			struct tm* ptm;
			gettimeofday(&val, NULL);
			ptm = localtime(&val.tv_sec);
			char buf[9];
			sprintf(buf, "%02d%02d%05ld", ptm->tm_min, ptm->tm_sec, val.tv_usec);
			return (key_t)atoi(buf);
		}